

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,size_t byte_,string *what_arg)

{
  char *what_arg_00;
  allocator local_142;
  byte local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator local_e9;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string w;
  string *what_arg_local;
  size_t byte__local;
  int id__local;
  
  w.field_2._8_8_ = what_arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"parse_error",&local_e9);
  exception::name(&local_c8,&local_e8,id_);
  std::operator+(&local_a8,&local_c8,"parse error");
  local_141 = 0;
  if (byte_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"",&local_142);
  }
  else {
    std::__cxx11::to_string(&local_140,byte_);
    local_141 = 1;
    std::operator+(&local_120," at byte ",&local_140);
  }
  std::operator+(&local_88,&local_a8,&local_120);
  std::operator+(&local_68,&local_88,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 w.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_120);
  if (byte_ == 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_142);
  }
  if ((local_141 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_140);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  what_arg_00 = (char *)std::__cxx11::string::c_str();
  parse_error(__return_storage_ptr__,id_,byte_,what_arg_00);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, std::size_t byte_, const std::string& what_arg) {
		std::string w = exception::name("parse_error", id_) + "parse error" +
						(byte_ != 0 ? (" at byte " + std::to_string(byte_)) : "") + ": " + what_arg;
		return parse_error(id_, byte_, w.c_str());
	}